

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlEntityPtr getParameterEntitySplit(void *ctx,xmlChar *name)

{
  xmlSchemaSAXPlugPtr ctxt;
  xmlChar *name_local;
  void *ctx_local;
  
  if (((ctx == (void *)0x0) || (*(long *)((long)ctx + 0x10) == 0)) ||
     (*(long *)(*(long *)((long)ctx + 0x10) + 0xc0) == 0)) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = (void *)(**(code **)(*(long *)((long)ctx + 0x10) + 0xc0))
                                  (*(undefined8 *)((long)ctx + 0x20),name);
  }
  return (xmlEntityPtr)ctx_local;
}

Assistant:

static xmlEntityPtr
getParameterEntitySplit(void *ctx, const xmlChar *name)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->getParameterEntity != NULL))
	return(ctxt->user_sax->getParameterEntity(ctxt->user_data, name));
    return(NULL);
}